

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-utils.h
# Opt level: O3

int parse_matrix_parameters(char **begin,char *end,float *values,int required,int optional)

{
  char *it_3;
  byte *pbVar1;
  byte bVar2;
  char *pcVar3;
  uint uVar4;
  char *it;
  byte *pbVar5;
  byte *pbVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  pbVar5 = (byte *)*begin;
  uVar4 = 0;
  if (pbVar5 < end) {
    bVar9 = true;
    do {
      pbVar6 = pbVar5;
      if ((0x20 < (ulong)*pbVar5) || ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0)) break;
      pbVar5 = pbVar5 + 1;
      bVar9 = pbVar5 < end;
      pbVar6 = (byte *)end;
    } while (pbVar5 != (byte *)end);
    if ((!(bool)(~bVar9 & 1U | end <= pbVar6)) && (*pbVar6 == 0x28)) {
      pbVar6 = pbVar6 + 1;
      pbVar5 = pbVar6;
      if (pbVar6 < end) {
        do {
          pbVar5 = pbVar6;
          if ((0x20 < (ulong)*pbVar6) || ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) == 0))
          break;
          pbVar6 = pbVar6 + 1;
          pbVar5 = (byte *)end;
        } while (pbVar6 != (byte *)end);
      }
      *begin = (char *)pbVar5;
      uVar4 = 0;
      if (pbVar5 < end) {
        uVar7 = 0;
        uVar4 = optional + required;
        if (uVar4 != 0 && SCARRY4(optional,required) == (int)uVar4 < 0) {
          uVar8 = 0;
          bVar9 = false;
          do {
            if (pbVar5 < end) {
              if (*pbVar5 != 0x2d) {
                if (*pbVar5 == 0x2b) {
                  pbVar5 = pbVar5 + 1;
                }
                goto LAB_00128470;
              }
              pbVar5 = pbVar5 + 1;
              fVar10 = -1.0;
            }
            else {
LAB_00128470:
              fVar10 = 1.0;
            }
            if (end <= pbVar5) goto LAB_0012872e;
            bVar2 = *pbVar5;
            fVar13 = 0.0;
            if (bVar2 == 0x2e) {
              fVar12 = 0.0;
              pbVar6 = pbVar5;
            }
            else {
              if (9 < (byte)(bVar2 - 0x30)) goto LAB_0012872e;
              pcVar3 = end + ~(ulong)pbVar5;
              fVar12 = 0.0;
              do {
                fVar12 = fVar12 * 10.0 + (float)(int)(bVar2 - 0x30);
                pbVar6 = (byte *)end;
                if (pcVar3 == (char *)0x0) break;
                bVar2 = pbVar5[1];
                pbVar6 = pbVar5 + 1;
                pcVar3 = pcVar3 + -1;
                pbVar5 = pbVar6;
              } while ((byte)(bVar2 - 0x30) < 10);
            }
            if ((pbVar6 < end) && (*pbVar6 == 0x2e)) {
              pbVar5 = pbVar6 + 1;
              if ((end <= pbVar5) || (bVar2 = *pbVar5, 9 < (byte)(bVar2 - 0x30))) goto LAB_0012872e;
              pcVar3 = end + (-2 - (long)pbVar6);
              fVar13 = 0.0;
              fVar11 = 1.0;
              do {
                fVar13 = fVar13 * 10.0 + (float)(int)(bVar2 - 0x30);
                fVar11 = fVar11 * 10.0;
                pbVar6 = (byte *)end;
                if (pcVar3 == (char *)0x0) break;
                bVar2 = pbVar5[1];
                pbVar6 = pbVar5 + 1;
                pcVar3 = pcVar3 + -1;
                pbVar5 = pbVar6;
              } while ((byte)(bVar2 - 0x30) < 10);
              fVar13 = fVar13 / fVar11;
            }
            if ((pbVar6 < end) && ((*pbVar6 | 0x20) == 0x65)) {
              pbVar5 = pbVar6 + 1;
              pbVar1 = pbVar5;
              if (pbVar5 < end) {
                bVar2 = *pbVar5;
                pbVar1 = pbVar6 + 2;
                if (bVar2 == 0x2b) goto LAB_00128598;
                pbVar1 = pbVar5;
                if (bVar2 == 0x2d) {
                  pbVar1 = pbVar6 + 2;
                }
                fVar11 = *(float *)(&DAT_00145174 + (ulong)(bVar2 == 0x2d) * 4);
              }
              else {
LAB_00128598:
                fVar11 = 1.0;
              }
              if ((end <= pbVar1) || (bVar2 = *pbVar1, 9 < (byte)(bVar2 - 0x30))) goto LAB_0012872e;
              pcVar3 = end + ~(ulong)pbVar1;
              fVar14 = 0.0;
              do {
                fVar14 = fVar14 * 10.0 + (float)(int)(bVar2 - 0x30);
                pbVar5 = (byte *)end;
                if (pcVar3 == (char *)0x0) break;
                bVar2 = pbVar1[1];
                pbVar5 = pbVar1 + 1;
                pcVar3 = pcVar3 + -1;
                pbVar1 = pbVar5;
              } while ((byte)(bVar2 - 0x30) < 10);
              *begin = (char *)pbVar5;
              fVar10 = fVar10 * (fVar12 + fVar13);
              values[uVar8] = fVar10;
              if ((fVar14 != 0.0) || (NAN(fVar14))) {
                fVar10 = powf(10.0,fVar11 * fVar14);
                fVar10 = fVar10 * values[uVar8];
                goto LAB_00128693;
              }
            }
            else {
              *begin = (char *)pbVar6;
              fVar10 = fVar10 * (fVar12 + fVar13);
LAB_00128693:
              values[uVar8] = fVar10;
            }
            if (3.4028235e+38 < ABS(fVar10)) goto LAB_0012872e;
            pbVar5 = (byte *)*begin;
            if (pbVar5 < end) {
              bVar9 = true;
              pbVar6 = pbVar5;
              do {
                pbVar1 = pbVar6;
                if ((0x20 < (ulong)*pbVar6) || ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) == 0))
                break;
                pbVar6 = pbVar6 + 1;
                bVar9 = pbVar6 < end;
                pbVar1 = (byte *)end;
              } while (pbVar6 != (byte *)end);
              if (((bool)(~bVar9 & 1U | end <= pbVar1)) || (*pbVar1 != 0x2c)) {
                bVar9 = false;
              }
              else {
                pbVar6 = pbVar1 + 1;
                bVar9 = true;
                pbVar1 = pbVar6;
                if (pbVar6 < end) {
                  do {
                    pbVar1 = pbVar6;
                    if ((0x20 < (ulong)*pbVar6) ||
                       ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) == 0)) break;
                    pbVar6 = pbVar6 + 1;
                    pbVar1 = (byte *)end;
                  } while (pbVar6 != (byte *)end);
                }
              }
              if (pbVar1 != pbVar5) {
                *begin = (char *)pbVar1;
                pbVar5 = pbVar1;
              }
            }
            else {
              bVar9 = false;
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 != uVar4);
          uVar8 = (ulong)uVar4;
LAB_0012872e:
          uVar7 = (uint)uVar8;
          if (bVar9) {
            return 0;
          }
        }
        if ((uVar7 == required || uVar7 == uVar4) && (pcVar3 = *begin, pcVar3 < end)) {
          uVar4 = 0;
          if (*pcVar3 == ')') {
            *begin = pcVar3 + 1;
            uVar4 = uVar7;
          }
        }
        else {
          uVar4 = 0;
        }
      }
    }
  }
  return uVar4;
}

Assistant:

static inline bool plutovg_skip_ws_and_delim(const char** begin, const char* end, char delim)
{
    const char* it = *begin;
    if(plutovg_skip_ws(&it, end)) {
        if(!plutovg_skip_delim(&it, end, delim))
            return false;
        plutovg_skip_ws(&it, end);
    } else {
        return false;
    }

    *begin = it;
    return it < end;
}